

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

RayTracingPipelineStateCreateInfoX * __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::SyncDesc
          (RayTracingPipelineStateCreateInfoX *this,SYNC_FLAGS UpdateFlags)

{
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *this_00;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  Uint32 UVar4;
  pointer pRVar5;
  pointer pRVar6;
  iterator __begin3;
  pointer pRVar7;
  pointer pRVar8;
  pointer pRVar9;
  IShader **ppIVar10;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar11;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  OldShaderObjects;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  local_40;
  
  pRVar8 = (pointer)(this->GeneralShaders).
                    super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (pointer)(this->GeneralShaders).
                    super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  UVar4 = (Uint32)((ulong)((long)pRVar1 - (long)pRVar8) >> 4);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount = UVar4;
  pRVar5 = (pointer)0x0;
  pRVar6 = pRVar8;
  if (UVar4 == 0) {
    pRVar6 = pRVar5;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pGeneralShaders = (RayTracingGeneralShaderGroup *)pRVar6
  ;
  pRVar6 = (pointer)(this->TriangleHitShaders).
                    super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  UVar4 = (int)((ulong)((long)(this->TriangleHitShaders).
                              super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6) >> 3) *
          -0x55555555;
  if (UVar4 == 0) {
    pRVar6 = pRVar5;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount = UVar4;
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pTriangleHitShaders =
       (RayTracingTriangleHitShaderGroup *)pRVar6;
  pRVar6 = (this->ProceduralHitShaders).
           super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  UVar4 = (Uint32)((ulong)((long)(this->ProceduralHitShaders).
                                 super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar6) >> 5);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount = UVar4;
  if (UVar4 == 0) {
    pRVar6 = pRVar5;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pProceduralHitShaders = pRVar6;
  if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != SYNC_FLAG_NONE) {
    if (pRVar8 != pRVar1) {
      do {
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&(this->
                                super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                                ).StringPool,pRVar8,pRVar6);
        pRVar6 = pVar11._8_8_;
        pRVar8->Name = *(Char **)((long)pVar11.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pRVar8 = (pointer)&pRVar8->pClosestHitShader;
      } while (pRVar8 != pRVar1);
    }
    pRVar7 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar7 != pRVar2) {
      do {
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&(this->
                                super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                                ).StringPool,pRVar7,pRVar6);
        pRVar6 = pVar11._8_8_;
        pRVar7->Name = *(Char **)((long)pVar11.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pRVar7 = pRVar7 + 1;
      } while (pRVar7 != pRVar2);
    }
    pRVar8 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar8 != pRVar1) {
      do {
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&(this->
                                super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                                ).StringPool,pRVar8,pRVar6);
        pRVar6 = pVar11._8_8_;
        pRVar8->Name = *(Char **)((long)pVar11.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pRVar8 = pRVar8 + 1;
      } while (pRVar8 != pRVar1);
    }
    if ((this->
        super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
        ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName != (Char *)0x0) {
      pVar11 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)&(this->
                              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                              ).StringPool,
                          &(this->
                           super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                           ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName,pRVar6);
      (this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName =
           *(Char **)((long)pVar11.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
  }
  if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != SYNC_FLAG_NONE) {
    this_00 = &this->ShaderObjects;
    local_40.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_40.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_40.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::_M_erase_at_end(this_00,(pointer)0x0);
    pRVar9 = (this->GeneralShaders).
             super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->GeneralShaders).
             super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar9 != pRVar3) {
      ppIVar10 = &pRVar9->pShader;
      do {
        if (*ppIVar10 != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar10);
        }
        pRVar9 = (pointer)(ppIVar10 + 1);
        ppIVar10 = ppIVar10 + 2;
      } while (pRVar9 != pRVar3);
    }
    pRVar7 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar7 != pRVar2) {
      ppIVar10 = &pRVar7->pAnyHitShader;
      do {
        if (ppIVar10[-1] != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar10 + -1);
        }
        if (*ppIVar10 != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar10);
        }
        pRVar7 = (pointer)(ppIVar10 + 1);
        ppIVar10 = ppIVar10 + 3;
      } while (pRVar7 != pRVar2);
    }
    pRVar8 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar8 != pRVar1) {
      ppIVar10 = &pRVar8->pAnyHitShader;
      do {
        if (ppIVar10[-2] != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar10 + -2);
        }
        if (ppIVar10[-1] != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar10 + -1);
        }
        if (*ppIVar10 != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar10);
        }
        pRVar8 = (pointer)(ppIVar10 + 1);
        ppIVar10 = ppIVar10 + 4;
      } while (pRVar8 != pRVar1);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::~vector(&local_40);
  }
  return this;
}

Assistant:

RayTracingPipelineStateCreateInfoX& SyncDesc(SYNC_FLAGS UpdateFlags)
    {
        GeneralShaderCount = static_cast<Uint32>(GeneralShaders.size());
        pGeneralShaders    = GeneralShaderCount > 0 ? GeneralShaders.data() : nullptr;

        TriangleHitShaderCount = static_cast<Uint32>(TriangleHitShaders.size());
        pTriangleHitShaders    = TriangleHitShaderCount > 0 ? TriangleHitShaders.data() : nullptr;

        ProceduralHitShaderCount = static_cast<Uint32>(ProceduralHitShaders.size());
        pProceduralHitShaders    = ProceduralHitShaderCount > 0 ? ProceduralHitShaders.data() : nullptr;

        if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != 0)
        {
            for (auto& Shader : GeneralShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : TriangleHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : ProceduralHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            if (pShaderRecordName != nullptr)
                pShaderRecordName = StringPool.emplace(pShaderRecordName).first->c_str();
        }

        if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != 0)
        {
            // Keep current shader objects alive
            std::vector<RefCntAutoPtr<IShader>> OldShaderObjects = std::move(ShaderObjects);

            ShaderObjects.clear();
            for (auto& Shader : GeneralShaders)
            {
                if (Shader.pShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pShader);
            }

            for (auto& Shader : TriangleHitShaders)
            {
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }

            for (auto& Shader : ProceduralHitShaders)
            {
                if (Shader.pIntersectionShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pIntersectionShader);
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }
        }

        return *this;
    }